

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mconv.cpp
# Opt level: O1

int CheckV2MVersion(uchar *inptr,int inlen,ssbase *base)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  int *piVar7;
  byte bVar8;
  uint uVar9;
  undefined1 *puVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  ssbase base_1;
  uint local_acc;
  long local_a90;
  uint *local_a88;
  int local_a80;
  int local_a7c;
  undefined4 local_a78;
  uchar *local_a70;
  int local_a68;
  uint local_a60 [2];
  undefined8 local_a58;
  int local_a50 [2];
  undefined8 local_a48;
  int local_a40 [2];
  long local_a38 [2];
  undefined1 local_a28 [2512];
  int local_58;
  uint local_54;
  uint local_50;
  long local_40;
  int local_38;
  
  memset(&local_a90,0,0xa60);
  if (0xb < inlen) {
    local_a80 = *(int *)inptr;
    local_a7c = local_a80 * 10000;
    local_a78 = *(undefined4 *)(inptr + 4);
    local_a68 = *(int *)(inptr + 8);
    local_a70 = inptr + 0xc;
    if ((uint)(local_a68 * 10) <= inlen - 0xcU) {
      puVar6 = (uint *)(local_a70 + (uint)(local_a68 * 10));
      puVar10 = local_a28;
      lVar13 = 0;
      do {
        uVar5 = *puVar6;
        local_a60[lVar13 * 0x28] = uVar5;
        puVar6 = puVar6 + 1;
        if (uVar5 != 0) {
          *(uint **)(local_a50 + lVar13 * 0x28 + -2) = puVar6;
          uVar15 = (ulong)(uVar5 * 5);
          iVar12 = *(int *)((long)puVar6 + uVar15);
          local_a50[lVar13 * 0x28] = iVar12;
          *(int **)(local_a40 + lVar13 * 0x28 + -2) = (int *)((long)puVar6 + uVar15) + 1;
          uVar16 = (ulong)(uint)(iVar12 << 2);
          lVar14 = (long)puVar6 + uVar16 + 8 + uVar15;
          iVar12 = *(int *)(lVar14 + -4);
          local_a40[lVar13 * 0x28] = iVar12;
          local_a38[lVar13 * 0x14] = lVar14;
          puVar6 = (uint *)((long)puVar6 + (ulong)(uint)(iVar12 * 5) + uVar16 + uVar15 + 8);
          lVar14 = 0;
          do {
            uVar5 = *puVar6;
            *(uint *)(puVar10 + lVar14 + -8) = uVar5;
            *(uint **)(puVar10 + lVar14) = puVar6 + 1;
            puVar6 = (uint *)((long)puVar6 + (ulong)(uVar5 << 2) + 4);
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0x70);
        }
        lVar13 = lVar13 + 1;
        puVar10 = puVar10 + 0xa0;
      } while (lVar13 != 0x10);
      local_58 = (int)puVar6 - (int)inptr;
      local_50 = *puVar6;
      uVar15 = (ulong)local_50;
      if (uVar15 < 0x20001) {
        local_a88 = puVar6 + 1;
        local_54 = *(uint *)((long)puVar6 + uVar15 + 4);
        if ((ulong)local_54 < 0x100001) {
          local_a90 = (long)puVar6 + uVar15 + 8;
          lVar13 = local_54 + uVar15;
          piVar7 = (int *)((long)puVar6 + lVar13 + 8);
          if ((long)piVar7 - (long)inptr < (long)(ulong)(uint)inlen) {
            local_38 = *piVar7;
            local_40 = (long)puVar6 + lVar13 + 0xc;
            if ((long)((long)piVar7 + (((long)local_38 + 4U) - (long)inptr)) <=
                (long)(ulong)(uint)inlen && (ulong)(long)local_38 < 0x2001) goto LAB_0010735c;
          }
          local_38 = 0;
          local_40 = 0;
        }
      }
    }
  }
LAB_0010735c:
  memcpy(base,&local_a90,0xa60);
  iVar12 = -1;
  if (base->patchsize != 0) {
    base->maxp = 0;
    lVar13 = 0;
    local_acc = 0;
    do {
      uVar5 = base->chan[lVar13].pcnum;
      uVar15 = (ulong)uVar5;
      uVar1 = base->chan[lVar13].notenum;
      lVar14 = (long)(int)uVar1;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
        iVar12 = 0;
      }
      else {
        puVar2 = base->chan[lVar13].pcptr;
        uVar16 = 0;
        iVar4 = 0;
        iVar12 = 0;
        iVar11 = 0;
        bVar8 = 0;
        do {
          iVar11 = ((uint)puVar2[uVar16] |
                   (uint)puVar2[uVar16 + uVar15] << 8 | (uint)puVar2[uVar16 + uVar15 * 2] << 0x10) +
                   iVar11;
          if ((iVar4 < iVar11) && (local_acc <= bVar8)) {
            local_acc = bVar8 + 1;
            base->maxp = local_acc;
          }
          bVar8 = bVar8 + puVar2[uVar16 + uVar15 * 3];
          if ((iVar12 < (int)uVar1) && (iVar4 <= iVar11)) {
            puVar3 = base->chan[lVar13].noteptr;
            lVar18 = (long)iVar12;
            do {
              lVar17 = lVar18 + 1;
              iVar4 = ((uint)puVar3[lVar18] |
                      (uint)puVar3[lVar17 + lVar14 + -1] << 8 |
                      (uint)puVar3[lVar17 + lVar14 * 2 + -1] << 0x10) + iVar4;
              iVar12 = iVar12 + 1;
              if (lVar14 <= lVar17) break;
              lVar18 = lVar17;
            } while (iVar4 <= iVar11);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar15);
        uVar5 = (uint)bVar8;
      }
      if ((iVar12 < (int)uVar1) && (local_acc <= uVar5)) {
        local_acc = uVar5 + 1;
        base->maxp = local_acc;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    iVar12 = -1;
    if (base->maxp != 0) {
      uVar5 = 0;
      if (v2version < 0) {
        iVar4 = -1;
      }
      else {
        puVar2 = base->patchmap;
        uVar9 = base->maxp - 1;
        uVar15 = 0;
        if (0 < (int)uVar9) {
          uVar15 = (ulong)uVar9;
        }
        uVar16 = 0xffffffff;
        uVar19 = 0;
        do {
          if (base->globsize == v2gsizes[uVar19]) {
            uVar20 = 0;
            do {
              uVar21 = uVar15;
              if (uVar15 == uVar20) goto LAB_001075b8;
              lVar13 = uVar20 * 4;
              iVar12 = (*(int *)(puVar2 + uVar20 * 4 + 4) - *(int *)(puVar2 + lVar13)) -
                       v2vsizes[uVar19];
              uVar21 = uVar20;
              if (0x55555554 < iVar12 * -0x55555555 + 0x2aaaaba9U) goto LAB_001075b8;
              uVar20 = uVar20 + 1;
            } while ((iVar12 + 0x2fd) / 3 ==
                     (uint)puVar2[(*(int *)(puVar2 + lVar13) + v2vsizes[uVar19]) - 0x2fe]);
            uVar21 = (ulong)((int)uVar20 - 1);
LAB_001075b8:
            bVar22 = (uint)uVar21 == uVar9;
            if (bVar22) {
              uVar16 = uVar19 & 0xffffffff;
            }
            uVar5 = uVar5 + bVar22;
          }
          iVar4 = (int)uVar16;
          uVar19 = uVar19 + 1;
        } while (uVar19 != (ulong)(uint)v2version + 1);
        uVar5 = (uint)(0 < (int)uVar5);
      }
      iVar12 = -2;
      if ((char)uVar5 != '\0') {
        iVar12 = v2version - iVar4;
      }
    }
  }
  return iVar12;
}

Assistant:

int CheckV2MVersion(const unsigned char *inptr, const int inlen, ssbase& base)
{
    int i;
    int patchesused[128];
    base = readfile(inptr,inlen);

    if (!base.patchsize)
        return -1;

    // determine highest used patch from progchange commands
    // (midiconv remaps the patches so that they're a
    //  continuous block from 0 to x)
    memset(patchesused, 0, sizeof(patchesused));
    base.maxp = 0;


    for (int ch = 0; ch < 16; ch++)
    {
        unsigned char p = 0;
        unsigned char v = 0;

        //int pcp = 0;
        int pct = 0;
        int pcn = base.chan[ch].pcnum;
        int np = 0;
        int nt = 0;
        int nn = base.chan[ch].notenum;

        int td;
        const uint8_t *ptr;
        for (int pcp = 0; pcp < pcn; pcp++)
        {
            // have there been notes? add last pgm
            ptr = base.chan[ch].pcptr;
            td  = 0x10000*ptr[2*pcn + pcp] + 0x100*ptr[1*pcn + pcp] + ptr[0*pcn + pcp];
            pct += td;
            if (pct > nt)
            {
                patchesused[p] = 1;
                if (p >= base.maxp) base.maxp = p + 1;
            }
            p += ptr[3*pcn + pcp];

            // walk notes until we reach current cmd
            while (np < nn && nt <= pct)
            {
                ptr = base.chan[ch].noteptr;
                td  = 0x10000*ptr[2*nn + np] + 0x100*ptr[1*nn + np] + ptr[0*nn + np];
                v  += ptr[4*nn+np];
                nt += td;
                np++;
            }
        }

        if (np < nn)
        {
            patchesused[p] = 1;
            if (p >= base.maxp) base.maxp = p + 1;
        }

    }
    printf2("patches used: %d\n", base.maxp);

    if (!base.maxp)
        return -1;

    // offset table to ptaches
    uint32_t *poffsets = (uint32_t *)base.patchmap;

    int matches = 0, best = -1;
    // for each version check...
    for (i = 0; i <= v2version; i++)
    {
        // ... if globals size is correct...
        if (base.globsize == v2gsizes[i])
        {
            printf2("globsize match: %d\n",i);
            // ... and if the size of all patches makes sense
            int p;
            for (p = 0; p < base.maxp - 1; p++)
            {
                int d = (poffsets[p + 1] - poffsets[p]) - (v2vsizes[i] - 3*255);
                if (d % 3) break;
                d /= 3;
                if (d != base.patchmap[poffsets[p] + v2vsizes[i] - 3*255 - 1])
                    break;
            }

            if (p == base.maxp - 1)
            {
                printf2("... ok!\n");
                best = i;
                matches++;
            } else
            {
                printf2("no match!\n");
            }
        }
    }

    // if we've got exactly one match, we're quite sure
    int ret = (matches >= 1) ? v2version - best : -2;
    printf2("found version delta: %d\n", ret);
    return ret;
}